

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ExpressionSyntax *node;
  MinTypMaxExpressionSyntax *pMVar1;
  Token TVar2;
  Token *unaff_retaddr;
  ExpressionSyntax *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  ExpressionSyntax *in_stack_ffffffffffffffc0;
  Info *args_4;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x94a515);
  node = deepClone<slang::syntax::ExpressionSyntax>
                   (in_stack_ffffffffffffffc0,(BumpAllocator *)__child_stack);
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  args_4 = TVar2.info;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x94a552);
  deepClone<slang::syntax::ExpressionSyntax>(node,(BumpAllocator *)__child_stack);
  parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x94a58f);
  deepClone<slang::syntax::ExpressionSyntax>(node,(BumpAllocator *)__child_stack);
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::MinTypMaxExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(ExpressionSyntax *)__fn,
                      args_3,(ExpressionSyntax *)args_4);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const MinTypMaxExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<MinTypMaxExpressionSyntax>(
        *deepClone<ExpressionSyntax>(*node.min, alloc),
        node.colon1.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.typ, alloc),
        node.colon2.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.max, alloc)
    );
}